

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void * mz_zip_reader_extract_file_to_heap
                 (mz_zip_archive *pZip,char *pFilename,size_t *pSize,mz_uint flags)

{
  mz_uint file_index_00;
  int file_index;
  mz_uint flags_local;
  size_t *pSize_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  
  file_index_00 = mz_zip_reader_locate_file(pZip,pFilename,(char *)0x0,flags);
  if ((int)file_index_00 < 0) {
    if (pSize != (size_t *)0x0) {
      *pSize = 0;
    }
    pZip_local = (mz_zip_archive *)0x0;
  }
  else {
    pZip_local = (mz_zip_archive *)mz_zip_reader_extract_to_heap(pZip,file_index_00,pSize,flags);
  }
  return pZip_local;
}

Assistant:

void *mz_zip_reader_extract_file_to_heap(mz_zip_archive *pZip,
                                         const char *pFilename, size_t *pSize,
                                         mz_uint flags) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0) {
    if (pSize)
      *pSize = 0;
    return MZ_FALSE;
  }
  return mz_zip_reader_extract_to_heap(pZip, file_index, pSize, flags);
}